

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToRGB24Row_C(uint8_t *src_argb,uint8_t *dst_rgb,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int width_local;
  uint8_t *dst_rgb_local;
  uint8_t *src_argb_local;
  
  dst_rgb_local = dst_rgb;
  src_argb_local = src_argb;
  for (x = 0; x < width; x = x + 1) {
    uVar1 = src_argb_local[1];
    uVar2 = src_argb_local[2];
    *dst_rgb_local = *src_argb_local;
    dst_rgb_local[1] = uVar1;
    dst_rgb_local[2] = uVar2;
    dst_rgb_local = dst_rgb_local + 3;
    src_argb_local = src_argb_local + 4;
  }
  return;
}

Assistant:

void ARGBToRGB24Row_C(const uint8_t* src_argb, uint8_t* dst_rgb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb[0];
    uint8_t g = src_argb[1];
    uint8_t r = src_argb[2];
    dst_rgb[0] = b;
    dst_rgb[1] = g;
    dst_rgb[2] = r;
    dst_rgb += 3;
    src_argb += 4;
  }
}